

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.h
# Opt level: O1

Rectangle * __thiscall
pm::World::createObject<pm::Rectangle,pm::Vector3,pm::Vector3,pm::Vector3,pm::Vector3>
          (World *this,Vector3 *args,Vector3 *args_1,Vector3 *args_2,Vector3 *args_3)

{
  tuple<pm::Geometry_*,_std::default_delete<pm::Geometry>_> this_00;
  pointer *__ptr;
  __uniq_ptr_impl<pm::Geometry,_std::default_delete<pm::Geometry>_> local_38;
  
  this_00.super__Tuple_impl<0UL,_pm::Geometry_*,_std::default_delete<pm::Geometry>_>.
  super__Head_base<0UL,_pm::Geometry_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_pm::Geometry_*,_std::default_delete<pm::Geometry>_>)operator_new(0x70);
  Rectangle::Rectangle
            ((Rectangle *)
             this_00.super__Tuple_impl<0UL,_pm::Geometry_*,_std::default_delete<pm::Geometry>_>.
             super__Head_base<0UL,_pm::Geometry_*,_false>._M_head_impl,args,args_1,args_2,args_3);
  local_38._M_t.super__Tuple_impl<0UL,_pm::Geometry_*,_std::default_delete<pm::Geometry>_>.
  super__Head_base<0UL,_pm::Geometry_*,_false>._M_head_impl =
       (tuple<pm::Geometry_*,_std::default_delete<pm::Geometry>_>)
       (tuple<pm::Geometry_*,_std::default_delete<pm::Geometry>_>)
       this_00.super__Tuple_impl<0UL,_pm::Geometry_*,_std::default_delete<pm::Geometry>_>.
       super__Head_base<0UL,_pm::Geometry_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>>,std::allocator<std::unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>>>>
  ::emplace_back<std::unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>>>
            ((vector<std::unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>>,std::allocator<std::unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>>>>
              *)&this->objects_,
             (unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&local_38);
  if ((_Tuple_impl<0UL,_pm::Geometry_*,_std::default_delete<pm::Geometry>_>)
      local_38._M_t.super__Tuple_impl<0UL,_pm::Geometry_*,_std::default_delete<pm::Geometry>_>.
      super__Head_base<0UL,_pm::Geometry_*,_false>._M_head_impl != (Geometry *)0x0) {
    (**(code **)(*(long *)local_38._M_t.
                          super__Tuple_impl<0UL,_pm::Geometry_*,_std::default_delete<pm::Geometry>_>
                          .super__Head_base<0UL,_pm::Geometry_*,_false>._M_head_impl + 8))();
  }
  return (Rectangle *)
         (this->objects_).
         super__Vector_base<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>,_std::allocator<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<pm::Geometry,_std::default_delete<pm::Geometry>_>._M_t.
         super__Tuple_impl<0UL,_pm::Geometry_*,_std::default_delete<pm::Geometry>_>.
         super__Head_base<0UL,_pm::Geometry_*,_false>._M_head_impl;
}

Assistant:

T *createObject(Args &&... args)
	{
		objects_.push_back(std::make_unique<T>(std::forward<Args>(args)...));
		return static_cast<T *>(objects_.back().get());
	}